

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::Texture3DSpecCase::verifyTexture
          (Texture3DSpecCase *this,GLContext *gles3Context,ReferenceContext *refContext)

{
  TestLog *log;
  deUint32 program;
  Surface *dst;
  Texture3DSpecCase *pTVar1;
  bool bVar2;
  bool bVar3;
  DataType samplerType;
  RenderTarget *pRVar4;
  TextureFormat *pTVar5;
  long *plVar6;
  byte bVar7;
  TextureFormat TVar8;
  long *plVar9;
  int iVar10;
  ReferenceContext *pRVar11;
  void *pvVar12;
  int iVar13;
  string desc;
  string name;
  string sliceStr;
  string levelStr;
  Surface result;
  Surface reference;
  UVec4 threshold;
  Texture3DShader shader;
  int local_47c;
  undefined1 local_470 [16];
  long local_460;
  TextureFormat TStack_458;
  Texture3DSpecCase *local_448;
  long *local_440;
  long local_438;
  long local_430;
  long lStack_428;
  int local_420;
  float local_41c;
  deUint32 local_418;
  deUint32 local_414;
  int local_410;
  int local_40c;
  ReferenceContext *local_408;
  TextureFormat local_400 [2];
  long local_3f0 [2];
  long *local_3e0;
  long local_3d8;
  long local_3d0;
  long lStack_3c8;
  long *local_3c0;
  long local_3b0 [2];
  long *local_3a0;
  long local_390 [2];
  Surface local_380;
  Surface local_368;
  long *local_350;
  long *local_348;
  ContextWrapper *local_340;
  UVec4 local_338;
  undefined1 local_328 [16];
  long local_318;
  TextureFormat TStack_310;
  ios_base local_2b8 [264];
  Texture3DShader local_1b0;
  
  samplerType = glu::getSampler3DType(this->m_texFormat);
  FboTestUtil::Texture3DShader::Texture3DShader(&local_1b0,samplerType,TYPE_FLOAT_VEC4);
  local_408 = (ReferenceContext *)gles3Context;
  local_414 = (*(gles3Context->super_Context)._vptr_Context[0x75])(gles3Context,&local_1b0);
  local_418 = (*(refContext->super_Context)._vptr_Context[0x75])(refContext,&local_1b0);
  FboTestUtil::Texture3DShader::setTexScaleBias
            (&local_1b0,&(this->m_texFormatInfo).lookupScale,&(this->m_texFormatInfo).lookupBias);
  local_340 = &(this->super_TextureSpecCase).super_ContextWrapper;
  iVar10 = 1;
  do {
    pRVar11 = refContext;
    if (iVar10 == 1) {
      pRVar11 = local_408;
    }
    sglr::ContextWrapper::setContext(local_340,&pRVar11->super_Context);
    sglr::ContextWrapper::glTexParameteri(local_340,0x806f,0x2801,0x2700);
    sglr::ContextWrapper::glTexParameteri(local_340,0x806f,0x2800,0x2600);
    sglr::ContextWrapper::glTexParameteri(local_340,0x806f,0x2802,0x812f);
    sglr::ContextWrapper::glTexParameteri(local_340,0x806f,0x2803,0x812f);
    sglr::ContextWrapper::glTexParameteri(local_340,0x806f,0x8072,0x812f);
    sglr::ContextWrapper::glTexParameteri(local_340,0x806f,0x813d,this->m_numLevels + -1);
    iVar10 = iVar10 + -1;
  } while (iVar10 == 0);
  if (0 < this->m_numLevels) {
    iVar10 = 0;
    local_448 = this;
    do {
      bVar7 = (byte)iVar10;
      local_40c = local_448->m_width >> (bVar7 & 0x1f);
      if (local_40c < 2) {
        local_40c = 1;
      }
      local_410 = local_448->m_height >> (bVar7 & 0x1f);
      if (local_410 < 2) {
        local_410 = 1;
      }
      local_420 = local_448->m_depth >> (bVar7 & 0x1f);
      iVar13 = 1;
      if (1 < local_420) {
        iVar13 = local_420;
      }
      local_41c = (float)iVar13;
      bVar2 = true;
      local_47c = 0;
      do {
        pTVar1 = local_448;
        tcu::Surface::Surface(&local_368);
        tcu::Surface::Surface(&local_380);
        FboTestUtil::Texture3DShader::setDepth(&local_1b0,((float)local_47c + 0.5) / local_41c);
        iVar13 = 1;
        do {
          program = local_418;
          dst = &local_368;
          pRVar11 = refContext;
          if (iVar13 == 1) {
            program = local_414;
            dst = &local_380;
            pRVar11 = local_408;
          }
          sglr::ContextWrapper::setContext(local_340,&pRVar11->super_Context);
          FboTestUtil::Texture3DShader::setUniforms(&local_1b0,&pRVar11->super_Context,program);
          TextureSpecCase::renderTex(&pTVar1->super_TextureSpecCase,dst,program,local_40c,local_410)
          ;
          iVar13 = iVar13 + -1;
        } while (iVar13 == 0);
        pRVar4 = Context::getRenderTarget((pTVar1->super_TextureSpecCase).super_TestCase.m_context);
        computeCompareThreshold((Functional *)&local_338,&pRVar4->m_pixelFormat,pTVar1->m_texFormat)
        ;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
        std::ostream::operator<<((ostringstream *)local_328,iVar10);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
        std::ios_base::~ios_base(local_2b8);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
        std::ostream::operator<<((ostringstream *)local_328,local_47c);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
        std::ios_base::~ios_base(local_2b8);
        local_440 = &local_430;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"Level","");
        pTVar5 = (TextureFormat *)
                 std::__cxx11::string::_M_append((char *)&local_440,(ulong)local_3a0);
        TVar8 = (TextureFormat)(pTVar5 + 2);
        if (*pTVar5 == TVar8) {
          local_460 = *(long *)TVar8;
          TStack_458 = pTVar5[3];
          local_470._0_8_ = &local_460;
        }
        else {
          local_460 = *(long *)TVar8;
          local_470._0_8_ = *pTVar5;
        }
        local_470._8_8_ = pTVar5[1];
        *pTVar5 = TVar8;
        pTVar5[1].order = R;
        pTVar5[1].type = SNORM_INT8;
        *(undefined1 *)&pTVar5[2].order = R;
        pTVar5 = (TextureFormat *)std::__cxx11::string::append(local_470);
        TVar8 = (TextureFormat)(pTVar5 + 2);
        if (*pTVar5 == TVar8) {
          local_318 = *(long *)TVar8;
          TStack_310 = pTVar5[3];
          local_328._0_8_ = &local_318;
        }
        else {
          local_318 = *(long *)TVar8;
          local_328._0_8_ = *pTVar5;
        }
        local_328._8_8_ = pTVar5[1];
        *pTVar5 = TVar8;
        pTVar5[1].order = R;
        pTVar5[1].type = SNORM_INT8;
        *(undefined1 *)&pTVar5[2].order = R;
        plVar6 = (long *)std::__cxx11::string::_M_append(local_328,(ulong)local_3c0);
        plVar9 = plVar6 + 2;
        if ((long *)*plVar6 == plVar9) {
          local_3d0 = *plVar9;
          lStack_3c8 = plVar6[3];
          local_3e0 = &local_3d0;
        }
        else {
          local_3d0 = *plVar9;
          local_3e0 = (long *)*plVar6;
        }
        local_3d8 = plVar6[1];
        *plVar6 = (long)plVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((long *)local_328._0_8_ != &local_318) {
          operator_delete((void *)local_328._0_8_,local_318 + 1);
        }
        if ((long *)local_470._0_8_ != &local_460) {
          operator_delete((void *)local_470._0_8_,local_460 + 1);
        }
        if (local_440 != &local_430) {
          operator_delete(local_440,local_430 + 1);
        }
        local_400[0] = (TextureFormat)local_3f0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_400,"Level ","");
        pTVar5 = (TextureFormat *)
                 std::__cxx11::string::_M_append((char *)local_400,(ulong)local_3a0);
        TVar8 = (TextureFormat)(pTVar5 + 2);
        if (*pTVar5 == TVar8) {
          local_460 = *(long *)TVar8;
          TStack_458 = pTVar5[3];
          local_470._0_8_ = &local_460;
        }
        else {
          local_460 = *(long *)TVar8;
          local_470._0_8_ = *pTVar5;
        }
        local_470._8_8_ = pTVar5[1];
        *pTVar5 = TVar8;
        pTVar5[1].order = R;
        pTVar5[1].type = SNORM_INT8;
        *(undefined1 *)&pTVar5[2].order = R;
        pTVar5 = (TextureFormat *)std::__cxx11::string::append(local_470);
        TVar8 = (TextureFormat)(pTVar5 + 2);
        if (*pTVar5 == TVar8) {
          local_318 = *(long *)TVar8;
          TStack_310 = pTVar5[3];
          local_328._0_8_ = &local_318;
        }
        else {
          local_318 = *(long *)TVar8;
          local_328._0_8_ = *pTVar5;
        }
        local_328._8_8_ = pTVar5[1];
        *pTVar5 = TVar8;
        pTVar5[1].order = R;
        pTVar5[1].type = SNORM_INT8;
        *(undefined1 *)&pTVar5[2].order = R;
        plVar6 = (long *)std::__cxx11::string::_M_append(local_328,(ulong)local_3c0);
        plVar9 = plVar6 + 2;
        if ((long *)*plVar6 == plVar9) {
          local_430 = *plVar9;
          lStack_428 = plVar6[3];
          local_440 = &local_430;
        }
        else {
          local_430 = *plVar9;
          local_440 = (long *)*plVar6;
        }
        local_438 = plVar6[1];
        *plVar6 = (long)plVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((long *)local_328._0_8_ != &local_318) {
          operator_delete((void *)local_328._0_8_,local_318 + 1);
        }
        if ((long *)local_470._0_8_ != &local_460) {
          operator_delete((void *)local_470._0_8_,local_460 + 1);
        }
        pTVar1 = local_448;
        if (local_400[0] != (TextureFormat)local_3f0) {
          operator_delete((void *)local_400[0],local_3f0[0] + 1);
        }
        log = ((pTVar1->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
        local_348 = local_3e0;
        local_350 = local_440;
        local_470._0_4_ = RGBA;
        local_470._4_4_ = UNORM_INT8;
        pvVar12 = (void *)local_368.m_pixels.m_cap;
        if ((void *)local_368.m_pixels.m_cap != (void *)0x0) {
          pvVar12 = local_368.m_pixels.m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)local_328,(TextureFormat *)local_470,local_368.m_width,
                   local_368.m_height,1,pvVar12);
        local_400[0].order = RGBA;
        local_400[0].type = UNORM_INT8;
        pvVar12 = (void *)local_380.m_pixels.m_cap;
        if ((void *)local_380.m_pixels.m_cap != (void *)0x0) {
          pvVar12 = local_380.m_pixels.m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)local_470,local_400,local_380.m_width,local_380.m_height,1,
                   pvVar12);
        bVar3 = tcu::intThresholdCompare
                          (log,(char *)local_348,(char *)local_350,
                           (ConstPixelBufferAccess *)local_328,(ConstPixelBufferAccess *)local_470,
                           &local_338,(local_47c != 0 || iVar10 != 0) + COMPARE_LOG_RESULT);
        if (!bVar3) {
          tcu::TestContext::setTestResult
                    ((local_448->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode
                     .m_testCtx,QP_TEST_RESULT_FAIL,"Image comparison failed");
          bVar2 = false;
        }
        if (local_440 != &local_430) {
          operator_delete(local_440,local_430 + 1);
        }
        if (local_3e0 != &local_3d0) {
          operator_delete(local_3e0,local_3d0 + 1);
        }
        if (local_3c0 != local_3b0) {
          operator_delete(local_3c0,local_3b0[0] + 1);
        }
        if (local_3a0 != local_390) {
          operator_delete(local_3a0,local_390[0] + 1);
        }
        tcu::Surface::~Surface(&local_380);
        tcu::Surface::~Surface(&local_368);
        local_47c = local_47c + 1;
      } while (bVar3 && local_47c < local_420);
    } while ((bVar2) && (iVar10 = iVar10 + 1, iVar10 < local_448->m_numLevels));
  }
  sglr::ShaderProgram::~ShaderProgram(&local_1b0.super_ShaderProgram);
  return;
}

Assistant:

void Texture3DSpecCase::verifyTexture (sglr::GLContext& gles3Context, sglr::ReferenceContext& refContext)
{
	Texture3DShader shader			(glu::getSampler3DType(m_texFormat), glu::TYPE_FLOAT_VEC4);
	deUint32		shaderIDgles	= gles3Context.createProgram(&shader);
	deUint32		shaderIDRef		= refContext.createProgram(&shader);

	shader.setTexScaleBias(m_texFormatInfo.lookupScale, m_texFormatInfo.lookupBias);

	// Set state.
	for (int ndx = 0; ndx < 2; ndx++)
	{
		sglr::Context* ctx = ndx ? static_cast<sglr::Context*>(&refContext) : static_cast<sglr::Context*>(&gles3Context);

		setContext(ctx);

		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER,	GL_NEAREST_MIPMAP_NEAREST);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_R,		GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAX_LEVEL,	m_numLevels-1);
	}

	for (int levelNdx = 0; levelNdx < m_numLevels; levelNdx++)
	{
		int		levelW		= de::max(1, m_width	>> levelNdx);
		int		levelH		= de::max(1, m_height	>> levelNdx);
		int		levelD		= de::max(1, m_depth	>> levelNdx);
		bool	levelOk		= true;

		for (int depth = 0; depth < levelD; depth++)
		{
			tcu::Surface	reference;
			tcu::Surface	result;

			shader.setDepth(((float)depth + 0.5f) / (float)levelD);

			for (int ndx = 0; ndx < 2; ndx++)
			{
				tcu::Surface&	dst			= ndx ? reference									: result;
				sglr::Context*	ctx			= ndx ? static_cast<sglr::Context*>(&refContext)	: static_cast<sglr::Context*>(&gles3Context);
				deUint32		shaderID	= ndx ? shaderIDRef									: shaderIDgles;

				setContext(ctx);
				shader.setUniforms(*ctx, shaderID);
				renderTex(dst, shaderID, levelW, levelH);
			}

			UVec4			threshold	= computeCompareThreshold(m_context.getRenderTarget().getPixelFormat(), m_texFormat);
			string			levelStr	= de::toString(levelNdx);
			string			sliceStr	= de::toString(depth);
			string			name		= string("Level") + levelStr + "Slice" + sliceStr;
			string			desc		= string("Level ") + levelStr + ", Slice " + sliceStr;
			bool			depthOk		= tcu::intThresholdCompare(m_testCtx.getLog(), name.c_str(), desc.c_str(), reference.getAccess(), result.getAccess(), threshold,
																   (levelNdx == 0 && depth == 0) ? tcu::COMPARE_LOG_RESULT : tcu::COMPARE_LOG_ON_ERROR);

			if (!depthOk)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
				levelOk = false;
				break;
			}
		}

		if (!levelOk)
			break;
	}
}